

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O1

int __thiscall
QtMWidgets::NavigationBar::addWidget
          (NavigationBar *this,QWidget *parent,QString *title,QWidget *widget)

{
  Type *pTVar1;
  Data *dd;
  Data *dd_00;
  bool bVar2;
  int iVar3;
  QSharedPointer<QtMWidgets::NavigationItem> *pQVar4;
  Type *pTVar5;
  QSharedPointer<QtMWidgets::NavigationItem> item;
  QWidget *local_50;
  QSharedPointer<QtMWidgets::NavigationItem> local_48;
  QWidget *local_38;
  
  local_50 = widget;
  local_38 = parent;
  bVar2 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::contains
                    (&((this->d).d)->itemsMap,&local_38);
  iVar3 = -1;
  if (bVar2) {
    iVar3 = QStackedWidget::addWidget((QWidget *)((this->d).d)->stack);
    pQVar4 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                       (&((this->d).d)->itemsMap,&local_38);
    pTVar1 = pQVar4->value;
    dd = pQVar4->d;
    if (dd != (Data *)0x0) {
      LOCK();
      (dd->weakref)._q_value.super___atomic_base<int>._M_i =
           (dd->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (dd->strongref)._q_value.super___atomic_base<int>._M_i =
           (dd->strongref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pTVar5 = (Type *)operator_new(0x40);
    (pTVar5->children).d.size = 0;
    pTVar5->parent = (NavigationItem *)0x0;
    (pTVar5->children).d.d = (Data *)0x0;
    (pTVar5->children).d.ptr = (QSharedPointer<QtMWidgets::NavigationItem> *)0x0;
    (pTVar5->title).d.size = 0;
    pTVar5->self = (QWidget *)0x0;
    (pTVar5->title).d.d = (Data *)0x0;
    (pTVar5->title).d.ptr = (char16_t *)0x0;
    local_48.value = pTVar5;
    local_48.d = (Data *)operator_new(0x18);
    *(Type **)(local_48.d + 1) = pTVar5;
    (local_48.d)->destroyer =
         QtSharedPointer::
         ExternalRefCountWithCustomDeleter<QtMWidgets::NavigationItem,_QtSharedPointer::NormalDeleter>
         ::deleter;
    ((local_48.d)->strongref)._q_value.super___atomic_base<int>._M_i = 1;
    ((local_48.d)->weakref)._q_value.super___atomic_base<int>._M_i = 1;
    QString::operator=(&(local_48.value)->title,title);
    (local_48.value)->parent = pTVar1;
    (local_48.value)->self = local_50;
    QtPrivate::QMovableArrayOps<QSharedPointer<QtMWidgets::NavigationItem>>::
    emplace<QSharedPointer<QtMWidgets::NavigationItem>const&>
              ((QMovableArrayOps<QSharedPointer<QtMWidgets::NavigationItem>> *)&pTVar1->children,
               (pTVar1->children).d.size,&local_48);
    pQVar4 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                       (&((this->d).d)->itemsMap,&local_50);
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->weakref)._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      ((local_48.d)->strongref)._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->strongref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    dd_00 = pQVar4->d;
    pQVar4->d = local_48.d;
    pQVar4->value = local_48.value;
    QSharedPointer<QtMWidgets::NavigationItem>::deref(dd_00);
    QSharedPointer<QtMWidgets::NavigationItem>::deref(local_48.d);
    QSharedPointer<QtMWidgets::NavigationItem>::deref(dd);
  }
  return iVar3;
}

Assistant:

int
NavigationBar::addWidget( QWidget * parent, const QString & title,
	QWidget * widget )
{
	int index = -1;

	if( d->itemsMap.contains( parent ) )
	{
		index = d->stack->addWidget( widget );

		QSharedPointer< NavigationItem > pp = d->itemsMap[ parent ];

		QSharedPointer< NavigationItem > item( new NavigationItem );
		item->title = title;
		item->parent = pp.data();
		item->self = widget;

		pp->children.append( item );
		d->itemsMap[ widget ] = item;
	}

	return index;
}